

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

QSize __thiscall QBoxLayout::maximumSize(QBoxLayout *this)

{
  Int IVar1;
  QBoxLayoutPrivate *pQVar2;
  long in_FS_OFFSET;
  QBoxLayoutPrivate *d;
  QSize s;
  QBoxLayoutPrivate *in_stack_00000060;
  int in_stack_ffffffffffffffa8;
  AlignmentFlag in_stack_ffffffffffffffac;
  QLayoutItem *in_stack_ffffffffffffffb0;
  QSize *this_00;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_24;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_20;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1c;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QBoxLayout *)0x2f3fda);
  if (((byte)pQVar2->field_0x118 >> 1 & 1) != 0) {
    d_func((QBoxLayout *)0x2f4000);
    QBoxLayoutPrivate::setupGeom(in_stack_00000060);
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &pQVar2->maxSize;
  QSize::QSize((QSize *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa8);
  local_10 = QSize::boundedTo(this_00,(QSize *)in_stack_ffffffffffffffb0);
  local_20.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)QLayoutItem::alignment(in_stack_ffffffffffffffb0);
  local_1c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&
                 ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar1 != 0) {
    QSize::setWidth((QSize *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  QLayoutItem::alignment(in_stack_ffffffffffffffb0);
  local_24.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&
                 ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  if (IVar1 != 0) {
    QSize::setHeight((QSize *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QBoxLayout::maximumSize() const
{
    Q_D(const QBoxLayout);
    if (d->dirty)
        const_cast<QBoxLayout*>(this)->d_func()->setupGeom();

    QSize s = d->maxSize.boundedTo(QSize(QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX));

    if (alignment() & Qt::AlignHorizontal_Mask)
        s.setWidth(QLAYOUTSIZE_MAX);
    if (alignment() & Qt::AlignVertical_Mask)
        s.setHeight(QLAYOUTSIZE_MAX);
    return s;
}